

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

bool __thiscall
LinearScan::NeedsLoopBackEdgeCompensation
          (LinearScan *this,Lifetime *lifetime,LabelInstr *loopTopLabel)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  
  if (((lifetime != (Lifetime *)0x0) && (bVar3 = StackSym::IsConst(lifetime->sym), !bVar3)) &&
     (uVar1 = lifetime->start, uVar5 = IR::Instr::GetNumber(&loopTopLabel->super_Instr),
     uVar1 <= uVar5)) {
    if ((loopTopLabel->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((loopTopLabel->m_loop->regAlloc).liveOnBackEdgeSyms,
                       (lifetime->sym->super_Sym).m_id);
    if ((BVar4 != '\0') &&
       ((uVar5 = IR::Instr::GetNumber(this->currentInstr), uVar5 < lifetime->end ||
        (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((this->curLoop->regAlloc).symRegUseBv,(lifetime->sym->super_Sym).m_id),
        BVar4 != '\0')))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool LinearScan::NeedsLoopBackEdgeCompensation(Lifetime *lifetime, IR::LabelInstr *loopTopLabel)
{
    if (!lifetime)
    {
        return false;
    }

    if (lifetime->sym->IsConst())
    {
        return false;
    }

    // No need if lifetime begins in the loop
    if (lifetime->start > loopTopLabel->GetNumber())
    {
        return false;
    }

    // Only needed if lifetime is live on the back-edge, and the register is used inside the loop, or the lifetime extends
    // beyond the loop (and compensation out of the loop may use this reg)...
    if (!loopTopLabel->GetLoop()->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id)
        || (this->currentInstr->GetNumber() >= lifetime->end && !this->curLoop->regAlloc.symRegUseBv->Test(lifetime->sym->m_id)))
    {
        return false;
    }

    return true;
}